

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TValue * luaH_set(lua_State *L,Table *t,TValue *key)

{
  TValue *pTVar1;
  char *fmt;
  
  pTVar1 = luaH_get(t,key);
  t->flags = '\0';
  if (pTVar1 != &luaO_nilobject_) {
    return pTVar1;
  }
  if (key->tt == 3) {
    if (!NAN((key->value).n)) goto LAB_001073fa;
    fmt = "table index is NaN";
  }
  else {
    if (key->tt != 0) {
LAB_001073fa:
      pTVar1 = newkey(L,t,key);
      return pTVar1;
    }
    fmt = "table index is nil";
  }
  luaG_runerror(L,fmt);
}

Assistant:

static TValue*luaH_set(lua_State*L,Table*t,const TValue*key){
const TValue*p=luaH_get(t,key);
t->flags=0;
if(p!=(&luaO_nilobject_))
return cast(TValue*,p);
else{
if(ttisnil(key))luaG_runerror(L,"table index is nil");
else if(ttisnumber(key)&&luai_numisnan(nvalue(key)))
luaG_runerror(L,"table index is NaN");
return newkey(L,t,key);
}
}